

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darData.c
# Opt level: O2

Vec_Int_t * Dar_LibReadPrios(void)

{
  Vec_Int_t *p;
  long lVar1;
  
  p = Vec_IntAlloc(0x60c4);
  for (lVar1 = 0; lVar1 != 0x18310; lVar1 = lVar1 + 4) {
    Vec_IntPush(p,*(int *)((long)s_Data3 + lVar1));
  }
  return p;
}

Assistant:

Vec_Int_t * Dar_LibReadPrios()
{
    Vec_Int_t * vResult;
    int i;
    vResult = Vec_IntAlloc( s_nDataSize3 );
    for ( i = 0; i < s_nDataSize3; i++ )
        Vec_IntPush( vResult, s_Data3[i] );
    return vResult;
}